

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_open(Curl_easy **curl)

{
  Curl_easy *data_00;
  char *pcVar1;
  Curl_easy *data;
  CURLcode result;
  Curl_easy **curl_local;
  
  data_00 = (Curl_easy *)(*Curl_ccalloc)(1,0x16d8);
  if (data_00 == (Curl_easy *)0x0) {
    curl_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    data_00->magic = 0xc0dedbad;
    pcVar1 = (char *)(*Curl_cmalloc)(0x4001);
    (data_00->state).buffer = pcVar1;
    if ((data_00->state).buffer == (char *)0x0) {
      data._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar1 = (char *)(*Curl_cmalloc)(0x100);
      (data_00->state).headerbuff = pcVar1;
      if ((data_00->state).headerbuff == (char *)0x0) {
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        data._4_4_ = Curl_init_userdefined(data_00);
        (data_00->state).headersize = 0x100;
        Curl_initinfo(data_00);
        (data_00->state).lastconnect = (connectdata *)0x0;
        (data_00->progress).flags = (data_00->progress).flags | 0x10;
        (data_00->state).current_speed = -1;
      }
    }
    if (data._4_4_ == CURLE_OK) {
      *curl = data_00;
    }
    else {
      (*Curl_cfree)((data_00->state).buffer);
      (*Curl_cfree)((data_00->state).headerbuff);
      Curl_freeset(data_00);
      (*Curl_cfree)(data_00);
    }
    curl_local._4_4_ = data._4_4_;
  }
  return curl_local._4_4_;
}

Assistant:

CURLcode Curl_open(struct Curl_easy **curl)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Very simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct Curl_easy));
  if(!data) {
    /* this is a very serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of Curl_easy failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;

  result = Curl_resolver_init(data, &data->state.resolver);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: resolver_init failed\n"));
    free(data);
    return result;
  }

  /* We do some initial setup here, all those fields that can't be just 0 */

  data->state.buffer = malloc(READBUFFER_SIZE + 1);
  if(!data->state.buffer) {
    DEBUGF(fprintf(stderr, "Error: malloc of buffer failed\n"));
    result = CURLE_OUT_OF_MEMORY;
  }
  else {
    data->state.headerbuff = malloc(HEADERSIZE);
    if(!data->state.headerbuff) {
      DEBUGF(fprintf(stderr, "Error: malloc of headerbuff failed\n"));
      result = CURLE_OUT_OF_MEMORY;
    }
    else {
      result = Curl_init_userdefined(data);

      data->state.headersize = HEADERSIZE;
      Curl_convert_init(data);
      Curl_initinfo(data);

      /* most recent connection is not yet defined */
      data->state.lastconnect = NULL;

      data->progress.flags |= PGRS_HIDE;
      data->state.current_speed = -1; /* init to negative == impossible */

      Curl_http2_init_state(&data->state);
    }
  }

  if(result) {
    Curl_resolver_cleanup(data->state.resolver);
    free(data->state.buffer);
    free(data->state.headerbuff);
    Curl_freeset(data);
    free(data);
    data = NULL;
  }
  else
    *curl = data;

  return result;
}